

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

char * __thiscall leveldb::VersionSet::LevelSummary(VersionSet *this,LevelSummaryStorage *scratch)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  LevelSummaryStorage *scratch_local;
  VersionSet *this_local;
  
  sVar1 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                    (this->current_->files_);
  sVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                    (this->current_->files_ + 1);
  sVar3 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                    (this->current_->files_ + 2);
  sVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                    (this->current_->files_ + 3);
  sVar5 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                    (this->current_->files_ + 4);
  sVar6 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                    (this->current_->files_ + 5);
  sVar7 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                    (this->current_->files_ + 6);
  snprintf(scratch->buffer,100,"files[ %d %d %d %d %d %d %d ]",sVar1 & 0xffffffff,sVar2 & 0xffffffff
           ,sVar3 & 0xffffffff,(int)sVar4,(int)sVar5,(int)sVar6,(int)sVar7);
  return scratch->buffer;
}

Assistant:

const char* VersionSet::LevelSummary(LevelSummaryStorage* scratch) const {
  // Update code if kNumLevels changes
  static_assert(config::kNumLevels == 7, "");
  std::snprintf(
      scratch->buffer, sizeof(scratch->buffer), "files[ %d %d %d %d %d %d %d ]",
      int(current_->files_[0].size()), int(current_->files_[1].size()),
      int(current_->files_[2].size()), int(current_->files_[3].size()),
      int(current_->files_[4].size()), int(current_->files_[5].size()),
      int(current_->files_[6].size()));
  return scratch->buffer;
}